

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat.cpp
# Opt level: O0

uint64_t EncodeDouble(double f)

{
  int iVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar3;
  uint64_t man;
  uint64_t sign;
  int cls;
  int exp;
  ulong local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  double local_20;
  ulong local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = std::fpclassify((double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_30 = 0;
  dVar3 = (double)((ulong)in_XMM0_Qa & 0x8000000000000000 | 0x3ff0000000000000);
  local_20 = in_XMM0_Qa;
  if ((dVar3 == -1.0) && (!NAN(dVar3))) {
    local_20 = -in_XMM0_Qa;
    local_30 = 0x8000000000000000;
  }
  if (iVar1 == 2) {
    local_18 = local_30;
  }
  else if (iVar1 == 1) {
    local_18 = local_30 | 0x7ff0000000000000;
  }
  else if (iVar1 == 0) {
    local_18 = 0x7ff8000000000000;
  }
  else {
    dVar3 = frexp(local_20,&local_c);
    dVar3 = round(dVar3 * 9007199254740992.0);
    uVar2 = (long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f;
    if (local_c < -0x3fd) {
      if (local_c < -0x43c) {
        local_18 = local_30;
      }
      else {
        local_18 = local_30 | uVar2 >> (3U - (char)local_c & 0x3f);
      }
    }
    else if (local_c < 0x401) {
      local_18 = local_30 | (long)(local_c + 0x3fe) << 0x34 | uVar2 & 0xfffffffffffff;
    }
    else {
      local_18 = local_30 | 0x7ff0000000000000;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t EncodeDouble(double f) noexcept {
    int cls = std::fpclassify(f);
    uint64_t sign = 0;
    if (copysign(1.0, f) == -1.0) {
        f = -f;
        sign = 0x8000000000000000;
    }
    // Zero
    if (cls == FP_ZERO) return sign;
    // Infinity
    if (cls == FP_INFINITE) return sign | 0x7ff0000000000000;
    // NaN
    if (cls == FP_NAN) return 0x7ff8000000000000;
    // Other numbers
    int exp;
    uint64_t man = std::round(std::frexp(f, &exp) * 9007199254740992.0);
    if (exp < -1021) {
        // Too small to represent, encode 0
        if (exp < -1084) return sign;
        // Subnormal numbers
        return sign | (man >> (-1021 - exp));
    } else {
        // Too big to represent, encode infinity
        if (exp > 1024) return sign | 0x7ff0000000000000;
        // Normal numbers
        return sign | (((uint64_t)(1022 + exp)) << 52) | (man & 0xFFFFFFFFFFFFF);
    }
}